

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-stb-image-write.h
# Opt level: O0

void stbiw__jpg_writeBits(stbi__write_context *s,int *bitBufP,int *bitCntP,unsigned_short *bs)

{
  uchar c_00;
  int local_30;
  uint uStack_2c;
  uchar c;
  int bitCnt;
  int bitBuf;
  unsigned_short *bs_local;
  int *bitCntP_local;
  int *bitBufP_local;
  stbi__write_context *s_local;
  
  local_30 = (uint)bs[1] + *bitCntP;
  uStack_2c = (uint)*bs << (0x18U - (char)local_30 & 0x1f) | *bitBufP;
  for (; 7 < local_30; local_30 = local_30 + -8) {
    c_00 = (uchar)(uStack_2c >> 0x10);
    stbiw__putc(s,c_00);
    if (c_00 == 0xff) {
      stbiw__putc(s,'\0');
    }
    uStack_2c = uStack_2c << 8;
  }
  *bitBufP = uStack_2c;
  *bitCntP = local_30;
  return;
}

Assistant:

static void stbiw__jpg_writeBits(stbi__write_context *s, int *bitBufP, int *bitCntP, const unsigned short *bs) {
   int bitBuf = *bitBufP, bitCnt = *bitCntP;
   bitCnt += bs[1];
   bitBuf |= bs[0] << (24 - bitCnt);
   while(bitCnt >= 8) {
      unsigned char c = (bitBuf >> 16) & 255;
      stbiw__putc(s, c);
      if(c == 255) {
         stbiw__putc(s, 0);
      }
      bitBuf <<= 8;
      bitCnt -= 8;
   }
   *bitBufP = bitBuf;
   *bitCntP = bitCnt;
}